

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::piece_picker::get_downloaders
          (piece_picker *this,
          vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *d,
          piece_index_t index)

{
  vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *pvVar1;
  uchar uVar2;
  uchar uVar3;
  int v;
  value_type *this_00;
  unsigned_long __n;
  reference dp;
  block_info *__x;
  int local_64;
  undefined1 auStack_60 [4];
  int j;
  span<const_libtorrent::piece_picker::block_info> binfo;
  __normal_iterator<const_libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
  local_48;
  const_iterator i;
  int local_34;
  int i_1;
  int num_blocks;
  vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *pvStack_20;
  download_queue_t state;
  vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *d_local;
  piece_picker *this_local;
  piece_index_t index_local;
  
  pvStack_20 = d;
  std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::clear(d);
  this_00 = libtorrent::aux::
            container_wrapper<libtorrent::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::piece_picker::piece_pos,_std::allocator<libtorrent::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)index.m_val);
  num_blocks._3_1_ = piece_pos::download_queue(this_00);
  v = blocks_in_piece(this,index);
  pvVar1 = pvStack_20;
  __n = libtorrent::aux::numeric_cast<unsigned_long,int,void>(v);
  std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::reserve
            (pvVar1,__n);
  uVar2 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                    ((strong_typedef *)((long)&num_blocks + 3));
  uVar3 = libtorrent::aux::strong_typedef::operator_cast_to_unsigned_char
                    ((strong_typedef *)&piece_pos::piece_open);
  if (uVar2 == uVar3) {
    for (local_34 = 0; local_34 < v; local_34 = local_34 + 1) {
      i._M_current = (downloading_piece *)0x0;
      std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
      push_back(pvStack_20,(value_type *)&i);
    }
  }
  else {
    binfo.m_len._7_1_ = num_blocks._3_1_;
    binfo.m_len._0_4_ = index.m_val;
    local_48._M_current = (downloading_piece *)find_dl_piece(this,num_blocks._3_1_,index);
    dp = __gnu_cxx::
         __normal_iterator<const_libtorrent::piece_picker::downloading_piece_*,_std::vector<libtorrent::piece_picker::downloading_piece,_std::allocator<libtorrent::piece_picker::downloading_piece>_>_>
         ::operator*(&local_48);
    _auStack_60 = blocks_for_piece(this,dp);
    for (local_64 = 0; pvVar1 = pvStack_20, local_64 != v; local_64 = local_64 + 1) {
      __x = span<const_libtorrent::piece_picker::block_info>::operator[]
                      ((span<const_libtorrent::piece_picker::block_info> *)auStack_60,(long)local_64
                      );
      std::vector<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
      push_back(pvVar1,&__x->peer);
    }
  }
  return;
}

Assistant:

void piece_picker::get_downloaders(std::vector<torrent_peer*>& d
		, piece_index_t const index) const
	{
		d.clear();
		auto const state = m_piece_map[index].download_queue();
		int const num_blocks = blocks_in_piece(index);
		d.reserve(aux::numeric_cast<std::size_t>(num_blocks));

		if (state == piece_pos::piece_open)
		{
			for (int i = 0; i < num_blocks; ++i) d.push_back(nullptr);
			return;
		}

		auto const i = find_dl_piece(state, index);
		TORRENT_ASSERT(i != m_downloads[state].end());
		auto const binfo = blocks_for_piece(*i);
		for (int j = 0; j != num_blocks; ++j)
		{
			TORRENT_ASSERT(binfo[j].peer == nullptr
				|| binfo[j].peer->in_use);
			d.push_back(binfo[j].peer);
		}
	}